

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpLogic
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  bool bVar1;
  bool bVar2;
  _func_int **pp_Var3;
  
  if (TokenKind == PipePipe) {
    bVar1 = ExpressionAST::asBool
                      ((LHS->_M_t).
                       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                       .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl);
    bVar2 = true;
    if (bVar1) goto LAB_00114bc5;
LAB_00114bbb:
    bVar2 = ExpressionAST::asBool
                      ((RHS->_M_t).
                       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                       .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl);
  }
  else {
    if (TokenKind == AmpAmp) {
      bVar1 = ExpressionAST::asBool
                        ((LHS->_M_t).
                         super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                         .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl);
      if (bVar1) goto LAB_00114bbb;
    }
    bVar2 = false;
  }
LAB_00114bc5:
  pp_Var3 = (_func_int **)operator_new(0x10);
  *(undefined4 *)(pp_Var3 + 1) = 2;
  *pp_Var3 = (_func_int *)&PTR__AST_001238f0;
  *(bool *)((long)pp_Var3 + 0xc) = bVar2;
  (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var3;
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpLogic(Token::TokenKind TokenKind,
                                     std::unique_ptr<ExpressionAST> LHS,
                                     std::unique_ptr<ExpressionAST> RHS) {
  bool Value;

  switch (TokenKind) {
  default:                Value = false; break;
  case Token::AmpAmp:     Value = LHS->asBool() && RHS->asBool(); break;
  case Token::PipePipe:   Value = LHS->asBool() || RHS->asBool(); break;
  }

  return std::unique_ptr<ExpressionAST>(new BoolAST(Value));
}